

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O3

wstring * __thiscall
NJamSpell::TSpellCorrector::FixFragmentNormalized
          (wstring *__return_storage_ptr__,TSpellCorrector *this,wstring *text)

{
  pointer *text_00;
  undefined4 *puVar1;
  pointer pwVar2;
  long lVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  size_t sVar6;
  wstring *pwVar7;
  long lVar8;
  size_t position;
  ulong uVar9;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 local_d0 [8];
  TWords candidates;
  wstring lowered;
  undefined1 local_88 [16];
  ulong local_78;
  undefined1 local_70 [8];
  TSentences sentences;
  TWords words;
  wstring *result;
  
  candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&lowered._M_string_length;
  pwVar2 = (text->_M_dataplus)._M_p;
  text_00 = &candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)text_00,pwVar2,pwVar2 + text->_M_string_length);
  ToLower((wstring *)text_00);
  TLangModel::Tokenize
            ((TSentences *)local_70,&this->LangModel,
             (wstring *)
             &candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  if ((undefined1  [8])
      sentences.
      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != local_70) {
    uVar9 = 0;
    do {
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::vector
                ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                 &sentences.
                  super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                 ((long)local_70 + uVar9 * 0x18));
      if (words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pointer)sentences.
                   super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        lVar8 = 0;
        position = 0;
        local_78 = uVar9;
        do {
          GetCandidatesRaw((TWords *)local_d0,this,
                           (TWords *)
                           &sentences.
                            super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,position);
          if ((undefined1  [8])
              candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
              _M_impl.super__Vector_impl_data._M_start != local_d0) {
            uVar4 = *(undefined4 *)((long)(wchar_t **)local_d0 + 4);
            sVar6 = *(size_t *)((long)local_d0 + 8);
            uVar5 = *(undefined4 *)((long)((long)local_d0 + 8) + 4);
            puVar1 = (undefined4 *)
                     ((long)&((sentences.
                               super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                             super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar8);
            *puVar1 = *(undefined4 *)(wchar_t **)local_d0;
            puVar1[1] = uVar4;
            puVar1[2] = (int)sVar6;
            puVar1[3] = uVar5;
          }
          lVar3 = *(long *)((long)&((sentences.
                                     super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                                   )._M_impl.super__Vector_impl_data._M_start + lVar8);
          local_f0[0] = local_e0;
          std::__cxx11::wstring::_M_construct<wchar_t_const*>
                    ((wstring *)local_f0,lVar3,
                     lVar3 + *(long *)((long)&((sentences.
                                                super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                              ->
                                              super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                                              )._M_impl.super__Vector_impl_data._M_finish + lVar8) *
                             4);
          pwVar7 = (wstring *)std::__cxx11::wstring::append((wchar_t *)local_f0);
          std::__cxx11::wstring::wstring((wstring *)((long)&lowered.field_2 + 8),pwVar7);
          std::__cxx11::wstring::_M_append((wchar_t *)__return_storage_ptr__,lowered.field_2._8_8_);
          if ((undefined1 *)lowered.field_2._8_8_ != local_88) {
            operator_delete((void *)lowered.field_2._8_8_);
          }
          if (local_f0[0] != local_e0) {
            operator_delete(local_f0[0]);
          }
          if (local_d0 != (undefined1  [8])0x0) {
            operator_delete((void *)local_d0);
          }
          uVar9 = local_78;
          position = position + 1;
          lVar8 = lVar8 + 0x10;
        } while (position <
                 (ulong)((long)words.
                               super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                               ._M_impl.super__Vector_impl_data._M_start -
                         (long)sentences.
                               super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage >> 4));
        if (words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)sentences.
                     super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::__cxx11::wstring::resize
                    ((ulong)__return_storage_ptr__,
                     (int)__return_storage_ptr__->_M_string_length + L'\xffffffff');
          std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__);
        }
      }
      if (sentences.
          super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(sentences.
                        super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)(((long)sentences.
                                    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start - (long)local_70 >> 3)
                            * -0x5555555555555555));
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::wstring::resize
                ((ulong)__return_storage_ptr__,
                 (int)__return_storage_ptr__->_M_string_length + L'\xffffffff');
    }
  }
  std::
  vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ::~vector((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             *)local_70);
  if (candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)&lowered._M_string_length) {
    operator_delete(candidates.
                    super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring TSpellCorrector::FixFragmentNormalized(const std::wstring& text) const {
    std::wstring lowered = text;
    ToLower(lowered);
    TSentences sentences = LangModel.Tokenize(lowered);
    std::wstring result;
    for (size_t i = 0; i < sentences.size(); ++i) {
        TWords words = sentences[i];
        for (size_t i = 0; i < words.size(); ++i) {
            TWords candidates = GetCandidatesRaw(words, i);
            if (candidates.size() > 0) {
                words[i] = candidates[0];
            }
            result += std::wstring(words[i].Ptr, words[i].Len) + L" ";
        }
        if (words.size() > 0) {
            result.resize(result.size() - 1);
            result += L". ";
        }
    }
    if (!result.empty()) {
        result.resize(result.size() - 1);
    }
    return result;
}